

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O1

int http_set_cookie(http_s *h,http_cookie_args_s cookie)

{
  http_cookie_args_s hVar1;
  http_s *phVar2;
  char cVar3;
  byte bVar4;
  FIOBJ str;
  fiobj_object_vtable_s *pfVar5;
  FIOBJ FVar6;
  FIOBJ *pFVar7;
  size_t sVar8;
  long lVar9;
  long lVar10;
  size_t sVar11;
  byte *pbVar12;
  char cVar13;
  ulong capa;
  uint uVar15;
  fio_str_info_s local_98;
  fio_str_info_s local_78;
  ulong local_60;
  undefined8 local_58;
  long local_50;
  char *local_48;
  undefined8 local_40;
  http_s *local_38;
  uint uVar14;
  
  hVar1 = cookie;
  if (h == (http_s *)0x0) {
    return -1;
  }
  if (((h->method == 0) && (h->status_str == 0)) && (h->status != 0)) {
    return -1;
  }
  if (0x7fff < cookie.name_len) {
    return -1;
  }
  if (0x1ffff < cookie.value_len) {
    return -1;
  }
  capa = cookie.value_len + cookie.name_len + 0x80;
  local_38 = h;
  str = fiobj_str_buf(capa);
  cVar13 = (char)str;
  uVar14 = (uint)str;
  lVar9 = (long)str >> 1;
  if (str == 0) {
LAB_001464c4:
    local_78.data = anon_var_dwarf_20f;
    uVar15 = 4;
    goto LAB_001464d7;
  }
  if ((str & 1) == 0) {
    cVar3 = '(';
    switch(uVar14 & 6) {
    case 0:
switchD_0014648b_caseD_0:
      cVar3 = *(char *)(str & 0xfffffffffffffff8);
      break;
    case 4:
switchD_0014648b_caseD_4:
      cVar3 = '*';
      break;
    case 6:
      if (cVar13 == '&') {
        local_78.data = anon_var_dwarf_21a;
        uVar15 = 5;
      }
      else {
        if ((uVar14 & 0xff) != 0x16) {
          if ((uVar14 & 0xff) == 6) goto LAB_001464c4;
          switch(uVar14 & 6) {
          case 0:
            goto switchD_0014648b_caseD_0;
          case 4:
            goto switchD_0014648b_caseD_4;
          case 6:
            cVar3 = cVar13;
          }
          break;
        }
        local_78.data = anon_var_dwarf_225;
        uVar15 = 4;
      }
LAB_001464d7:
      local_78.capa = 0;
      local_78.len = (size_t)uVar15;
      goto LAB_00146577;
    }
    switch(cVar3) {
    case '\'':
      pfVar5 = &FIOBJECT_VTABLE_FLOAT;
      break;
    case '(':
      pfVar5 = &FIOBJECT_VTABLE_STRING;
      break;
    case ')':
      pfVar5 = &FIOBJECT_VTABLE_ARRAY;
      break;
    case '*':
      pfVar5 = &FIOBJECT_VTABLE_HASH;
      break;
    case '+':
      pfVar5 = &FIOBJECT_VTABLE_DATA;
      break;
    default:
      pfVar5 = &FIOBJECT_VTABLE_NUMBER;
    }
    (*pfVar5->to_str)(&local_78,str);
  }
  else {
    fio_ltocstr(&local_78,lVar9);
  }
LAB_00146577:
  local_48 = (char *)cookie.value_len;
  if (cookie.name == (char *)0x0) {
LAB_001469a8:
    lVar10 = 0;
  }
  else if (cookie.name_len == 0) {
    bVar4 = *cookie.name;
    if (bVar4 == 0) goto LAB_001469a8;
    local_60 = (ulong)(uVar14 & 6);
    local_40 = (char *)(str & 0xfffffffffffffff8);
    local_58 = (char *)(CONCAT44(local_58._4_4_,uVar14) & 0xffffffff000000ff);
    lVar10 = 0;
    pbVar12 = (byte *)cookie.name;
    local_50 = lVar9;
    do {
      if ("\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01"
          [bVar4] == '\0') {
        local_78.data[lVar10] = bVar4;
        lVar10 = lVar10 + 1;
      }
      else {
        if ((http_set_cookie_warn_illegal == '\0') &&
           (http_set_cookie_warn_illegal = '\x01', 2 < FIO_LOG_LEVEL)) {
          FIO_LOG2STDERR("WARNING: illegal char 0x%.2x in cookie name (in %s)\n         automatic %% encoding applied"
                         ,(ulong)(uint)(int)(char)bVar4,cookie.name);
        }
        local_78.data[lVar10] = '%';
        local_78.data[lVar10 + 1] = "0123456789ABCDEF"[*pbVar12 >> 4];
        local_78.data[lVar10 + 2] = "0123456789ABCDEF"[*pbVar12 & 0xf];
        lVar10 = lVar10 + 3;
      }
      if (capa <= lVar10 + 3U) {
        capa = capa + 0x20;
        fiobj_str_capa_assert(str,capa);
        if (str == 0) {
LAB_001468cc:
          local_98.data = anon_var_dwarf_20f;
          local_98.len._0_4_ = 4;
          goto LAB_001468df;
        }
        if ((str & 1) == 0) {
          cVar3 = '(';
          switch((long)&switchD_0014689f::switchdataD_00168748 +
                 (long)(int)(&switchD_0014689f::switchdataD_00168748)[local_60]) {
          case 0x1468a1:
switchD_0014689f_caseD_1468a1:
            cVar3 = *local_40;
            break;
          case 0x1468bc:
            if (cVar13 == '&') {
              local_98.data = anon_var_dwarf_21a;
              local_98.len._0_4_ = 5;
            }
            else {
              if ((int)local_58 != 0x16) {
                if ((int)local_58 == 6) goto LAB_001468cc;
                switch((long)&switchD_00146925::switchdataD_00168764 +
                       (long)(int)(&switchD_00146925::switchdataD_00168764)[local_60]) {
                case 0x1468a1:
                  goto switchD_0014689f_caseD_1468a1;
                case 0x146927:
                  goto switchD_0014689f_caseD_146927;
                case 0x1469a3:
                  cVar3 = cVar13;
                }
                break;
              }
              local_98.data = anon_var_dwarf_225;
              local_98.len._0_4_ = 4;
            }
LAB_001468df:
            local_98.capa._0_4_ = 0;
            local_98.capa._4_4_ = 0;
            local_98.len._4_4_ = 0;
            goto LAB_0014697f;
          case 0x146927:
switchD_0014689f_caseD_146927:
            cVar3 = '*';
          }
          pfVar5 = &FIOBJECT_VTABLE_NUMBER;
          switch(cVar3) {
          case '\'':
            pfVar5 = &FIOBJECT_VTABLE_FLOAT;
            break;
          case '(':
            pfVar5 = &FIOBJECT_VTABLE_STRING;
            break;
          case ')':
            pfVar5 = &FIOBJECT_VTABLE_ARRAY;
            break;
          case '*':
            pfVar5 = &FIOBJECT_VTABLE_HASH;
            break;
          case '+':
            pfVar5 = &FIOBJECT_VTABLE_DATA;
          }
          (*pfVar5->to_str)(&local_98,str);
        }
        else {
          fio_ltocstr(&local_98,local_50);
        }
LAB_0014697f:
        local_78.data = local_98.data;
        local_78.capa = CONCAT44(local_98.capa._4_4_,(undefined4)local_98.capa);
        local_78.len = CONCAT44(local_98.len._4_4_,(undefined4)local_98.len);
      }
      bVar4 = pbVar12[1];
      pbVar12 = pbVar12 + 1;
    } while (bVar4 != 0);
  }
  else {
    local_60 = (ulong)(uVar14 & 6);
    local_58 = (char *)(str & 0xfffffffffffffff8);
    local_40 = (char *)(CONCAT44(local_40._4_4_,uVar14) & 0xffffffff000000ff);
    sVar11 = 0;
    lVar10 = 0;
    local_50 = lVar9;
    do {
      bVar4 = cookie.name[sVar11];
      if ("\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01"
          [bVar4] == '\0') {
        local_78.data[lVar10] = bVar4;
        lVar10 = lVar10 + 1;
      }
      else {
        if ((http_set_cookie_warn_illegal == '\0') &&
           (http_set_cookie_warn_illegal = '\x01', 2 < FIO_LOG_LEVEL)) {
          FIO_LOG2STDERR("WARNING: illegal char 0x%.2x in cookie name (in %s)\n         automatic %% encoding applied"
                         ,(ulong)(uint)(int)(char)bVar4,cookie.name);
        }
        local_78.data[lVar10] = '%';
        local_78.data[lVar10 + 1] = "0123456789ABCDEF"[(byte)cookie.name[sVar11] >> 4];
        local_78.data[lVar10 + 2] = "0123456789ABCDEF"[(byte)cookie.name[sVar11] & 0xf];
        lVar10 = lVar10 + 3;
      }
      if (capa <= lVar10 + 3U) {
        capa = capa + 0x20;
        fiobj_str_capa_assert(str,capa);
        if (str == 0) {
LAB_001466be:
          local_98.data = anon_var_dwarf_20f;
          local_98.len._0_4_ = 4;
          goto LAB_001466d1;
        }
        if ((str & 1) == 0) {
          cVar3 = '(';
          switch((long)&switchD_0014668a::switchdataD_001686fc +
                 (long)(int)(&switchD_0014668a::switchdataD_001686fc)[local_60]) {
          case 0x14668c:
switchD_0014668a_caseD_14668c:
            cVar3 = *local_58;
            break;
          case 0x1466aa:
            if (cVar13 == '&') {
              local_98.data = anon_var_dwarf_21a;
              local_98.len._0_4_ = 5;
            }
            else {
              if ((int)local_40 != 0x16) {
                if ((int)local_40 == 6) goto LAB_001466be;
                switch((long)&switchD_00146717::switchdataD_00168718 +
                       (long)(int)(&switchD_00146717::switchdataD_00168718)[local_60]) {
                case 0x14668c:
                  goto switchD_0014668a_caseD_14668c;
                case 0x146719:
                  goto switchD_0014668a_caseD_146719;
                case 0x146795:
                  cVar3 = cVar13;
                }
                break;
              }
              local_98.data = anon_var_dwarf_225;
              local_98.len._0_4_ = 4;
            }
LAB_001466d1:
            local_98.capa._0_4_ = 0;
            local_98.capa._4_4_ = 0;
            local_98.len._4_4_ = 0;
            goto LAB_00146771;
          case 0x146719:
switchD_0014668a_caseD_146719:
            cVar3 = '*';
          }
          pfVar5 = &FIOBJECT_VTABLE_NUMBER;
          switch(cVar3) {
          case '\'':
            pfVar5 = &FIOBJECT_VTABLE_FLOAT;
            break;
          case '(':
            pfVar5 = &FIOBJECT_VTABLE_STRING;
            break;
          case ')':
            pfVar5 = &FIOBJECT_VTABLE_ARRAY;
            break;
          case '*':
            pfVar5 = &FIOBJECT_VTABLE_HASH;
            break;
          case '+':
            pfVar5 = &FIOBJECT_VTABLE_DATA;
          }
          (*pfVar5->to_str)(&local_98,str);
        }
        else {
          fio_ltocstr(&local_98,local_50);
        }
LAB_00146771:
        local_78.data = local_98.data;
        local_78.capa = CONCAT44(local_98.capa._4_4_,(undefined4)local_98.capa);
        local_78.len = CONCAT44(local_98.len._4_4_,(undefined4)local_98.len);
      }
      sVar11 = sVar11 + 1;
    } while (cookie.name_len != sVar11);
  }
  local_78.data[lVar10] = '=';
  lVar10 = lVar10 + 1;
  if (cookie.value == (char *)0x0) {
    cookie.max_age = -1;
  }
  else if (local_48 == (char *)0x0) {
    bVar4 = *cookie.value;
    if (bVar4 != 0) {
      local_60 = (ulong)(uVar14 & 6);
      local_58 = (char *)(str & 0xfffffffffffffff8);
      local_48 = (char *)(str & 0xff);
      pbVar12 = (byte *)cookie.value;
      local_50 = lVar9;
      do {
        if ("\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01"
            [bVar4] == '\0') {
          local_78.data[lVar10] = bVar4;
          lVar10 = lVar10 + 1;
        }
        else {
          if ((http_set_cookie_warn_illegal == '\0') &&
             (http_set_cookie_warn_illegal = '\x01', 2 < FIO_LOG_LEVEL)) {
            FIO_LOG2STDERR("WARNING: illegal char 0x%.2x in cookie value (in %s)\n         automatic %% encoding applied"
                           ,(ulong)(uint)(int)(char)bVar4,cookie.value);
          }
          local_78.data[lVar10] = '%';
          local_78.data[lVar10 + 1] = "0123456789ABCDEF"[*pbVar12 >> 4];
          local_78.data[lVar10 + 2] = "0123456789ABCDEF"[*pbVar12 & 0xf];
          lVar10 = lVar10 + 3;
        }
        if (capa <= lVar10 + 3U) {
          capa = capa + 0x20;
          fiobj_str_capa_assert(str,capa);
          if (str == 0) {
LAB_00146ddf:
            local_98.data = anon_var_dwarf_20f;
            local_98.len._0_4_ = 4;
            goto LAB_00146df2;
          }
          if ((str & 1) == 0) {
            cVar3 = '(';
            switch((long)&switchD_00146db2::switchdataD_001687e0 +
                   (long)(int)(&switchD_00146db2::switchdataD_001687e0)[local_60]) {
            case 0x146db4:
switchD_00146db2_caseD_146db4:
              cVar3 = *local_58;
              break;
            case 0x146dcf:
              if (cVar13 == '&') {
                local_98.data = anon_var_dwarf_21a;
                local_98.len._0_4_ = 5;
              }
              else {
                if ((int)local_48 != 0x16) {
                  if ((int)local_48 == 6) goto LAB_00146ddf;
                  switch((long)&switchD_00146e38::switchdataD_001687fc +
                         (long)(int)(&switchD_00146e38::switchdataD_001687fc)[local_60]) {
                  case 0x146db4:
                    goto switchD_00146db2_caseD_146db4;
                  case 0x146e3a:
                    goto switchD_00146db2_caseD_146e3a;
                  case 0x146eb9:
                    cVar3 = cVar13;
                  }
                  break;
                }
                local_98.data = anon_var_dwarf_225;
                local_98.len._0_4_ = 4;
              }
LAB_00146df2:
              local_98.capa._0_4_ = 0;
              local_98.capa._4_4_ = 0;
              local_98.len._4_4_ = 0;
              goto LAB_00146e92;
            case 0x146e3a:
switchD_00146db2_caseD_146e3a:
              cVar3 = '*';
            }
            pfVar5 = &FIOBJECT_VTABLE_NUMBER;
            switch(cVar3) {
            case '\'':
              pfVar5 = &FIOBJECT_VTABLE_FLOAT;
              break;
            case '(':
              pfVar5 = &FIOBJECT_VTABLE_STRING;
              break;
            case ')':
              pfVar5 = &FIOBJECT_VTABLE_ARRAY;
              break;
            case '*':
              pfVar5 = &FIOBJECT_VTABLE_HASH;
              break;
            case '+':
              pfVar5 = &FIOBJECT_VTABLE_DATA;
            }
            (*pfVar5->to_str)(&local_98,str);
          }
          else {
            fio_ltocstr(&local_98,local_50);
          }
LAB_00146e92:
          local_78.data = local_98.data;
          local_78.capa = CONCAT44(local_98.capa._4_4_,(undefined4)local_98.capa);
          local_78.len = CONCAT44(local_98.len._4_4_,(undefined4)local_98.len);
        }
        bVar4 = pbVar12[1];
        pbVar12 = pbVar12 + 1;
      } while (bVar4 != 0);
    }
  }
  else if (cookie.value_len != 0) {
    local_60 = (ulong)(uVar14 & 6);
    local_48 = (char *)(str & 0xfffffffffffffff8);
    local_58 = (char *)(CONCAT44(local_58._4_4_,uVar14) & 0xffffffff000000ff);
    sVar11 = 0;
    local_50 = lVar9;
    do {
      bVar4 = cookie.value[sVar11];
      if ("\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01"
          [bVar4] == '\0') {
        local_78.data[lVar10] = bVar4;
        lVar10 = lVar10 + 1;
      }
      else {
        if ((http_set_cookie_warn_illegal == '\0') &&
           (http_set_cookie_warn_illegal = '\x01', 2 < FIO_LOG_LEVEL)) {
          FIO_LOG2STDERR("WARNING: illegal char 0x%.2x in cookie value (in %s)\n         automatic %% encoding applied"
                         ,(ulong)(uint)(int)(char)bVar4,cookie.value);
        }
        local_78.data[lVar10] = '%';
        local_78.data[lVar10 + 1] = "0123456789ABCDEF"[(byte)cookie.value[sVar11] >> 4];
        local_78.data[lVar10 + 2] = "0123456789ABCDEF"[(byte)cookie.value[sVar11] & 0xf];
        lVar10 = lVar10 + 3;
      }
      if (capa <= lVar10 + 3U) {
        capa = capa + 0x20;
        fiobj_str_capa_assert(str,capa);
        if (str == 0) {
LAB_00146b10:
          local_98.data = anon_var_dwarf_20f;
          local_98.len._0_4_ = 4;
          goto LAB_00146b23;
        }
        if ((str & 1) == 0) {
          cVar3 = '(';
          switch((long)&switchD_00146adc::switchdataD_00168794 +
                 (long)(int)(&switchD_00146adc::switchdataD_00168794)[local_60]) {
          case 0x146ade:
switchD_00146adc_caseD_146ade:
            cVar3 = *local_48;
            break;
          case 0x146afc:
            if (cVar13 == '&') {
              local_98.data = anon_var_dwarf_21a;
              local_98.len._0_4_ = 5;
            }
            else {
              if ((int)local_58 != 0x16) {
                if ((int)local_58 == 6) goto LAB_00146b10;
                switch((long)&switchD_00146b69::switchdataD_001687b0 +
                       (long)(int)(&switchD_00146b69::switchdataD_001687b0)[local_60]) {
                case 0x146ade:
                  goto switchD_00146adc_caseD_146ade;
                case 0x146b6b:
                  goto switchD_00146adc_caseD_146b6b;
                case 0x146be4:
                  cVar3 = cVar13;
                }
                break;
              }
              local_98.data = anon_var_dwarf_225;
              local_98.len._0_4_ = 4;
            }
LAB_00146b23:
            local_98.capa._0_4_ = 0;
            local_98.capa._4_4_ = 0;
            local_98.len._4_4_ = 0;
            goto LAB_00146bc3;
          case 0x146b6b:
switchD_00146adc_caseD_146b6b:
            cVar3 = '*';
          }
          pfVar5 = &FIOBJECT_VTABLE_NUMBER;
          switch(cVar3) {
          case '\'':
            pfVar5 = &FIOBJECT_VTABLE_FLOAT;
            break;
          case '(':
            pfVar5 = &FIOBJECT_VTABLE_STRING;
            break;
          case ')':
            pfVar5 = &FIOBJECT_VTABLE_ARRAY;
            break;
          case '*':
            pfVar5 = &FIOBJECT_VTABLE_HASH;
            break;
          case '+':
            pfVar5 = &FIOBJECT_VTABLE_DATA;
          }
          (*pfVar5->to_str)(&local_98,str);
        }
        else {
          fio_ltocstr(&local_98,local_50);
        }
LAB_00146bc3:
        local_78.data = local_98.data;
        local_78.capa = CONCAT44(local_98.capa._4_4_,(undefined4)local_98.capa);
        local_78.len = CONCAT44(local_98.len._4_4_,(undefined4)local_98.len);
      }
      sVar11 = sVar11 + 1;
    } while (cookie.value_len != sVar11);
  }
  phVar2 = local_38;
  lVar9 = *(long *)((local_38->private_data).flag + 0x38);
  if ((lVar9 == 0) || (*(char *)(lVar9 + 0x7b) == '\0')) {
    local_78.data[lVar10] = ';';
    local_78.data[lVar10 + 1] = ' ';
    if ((local_38->status_str == 0) && (local_38->status != 0)) {
      if (capa <= lVar10 + 0x2aU) {
        fiobj_str_capa_assert(str,lVar10 + 0x2aU);
        fiobj_obj2cstr(&local_98,str);
        local_78.data = local_98.data;
        local_78.capa = CONCAT44(local_98.capa._4_4_,(undefined4)local_98.capa);
        local_78.len = CONCAT44(local_98.len._4_4_,(undefined4)local_98.len);
      }
      if ((long)cookie.max_age == 0) {
        sVar11 = lVar10 + 2;
      }
      else {
        builtin_strncpy(local_78.data + lVar10 + 2,"Max-Age=",8);
        sVar8 = fio_ltoa(local_78.data + lVar10 + 10,(long)cookie.max_age,'\n');
        local_78.data[sVar8 + lVar10 + 10] = ';';
        sVar11 = lVar10 + sVar8 + 0xc;
        local_78.data[sVar8 + lVar10 + 0xb] = ' ';
      }
      fiobj_str_resize(str,sVar11);
      if (cookie.domain_len != 0 && cookie.domain != (char *)0x0) {
        fiobj_str_write(str,"domain=",7);
        fiobj_str_write(str,cookie.domain,cookie.domain_len);
        fiobj_str_write(str,";",1);
        local_78.data[sVar11] = ' ';
        sVar11 = sVar11 + 1;
      }
      if (cookie.path_len != 0 && cookie.path != (char *)0x0) {
        fiobj_str_write(str,"path=",5);
        fiobj_str_write(str,cookie.path,cookie.path_len);
        fiobj_str_write(str,";",1);
        local_78.data[sVar11] = ' ';
      }
      if (((undefined1  [72])hVar1 & (undefined1  [72])0x200000000) != (undefined1  [72])0x0) {
        fiobj_str_write(str,"HttpOnly;",9);
      }
      if (((undefined1  [72])hVar1 & (undefined1  [72])0x100000000) != (undefined1  [72])0x0) {
        fiobj_str_write(str,"secure;",7);
      }
      FVar6 = (phVar2->private_data).out_headers;
      pFVar7 = &HTTP_HEADER_SET_COOKIE;
      goto LAB_00147073;
    }
    if (http_set_cookie::cookie_hash == 0) {
      http_set_cookie::cookie_hash = fio_siphash13("cookie",6,0x144e87,0x1453b6);
    }
    FVar6 = fiobj_hash_get2((phVar2->private_data).out_headers,http_set_cookie::cookie_hash);
    if (FVar6 != 0) {
      fiobj_str_concat(FVar6,str);
      fiobj_free(str);
      return 0;
    }
  }
  else if (cookie.value == (char *)0x0) {
    fiobj_free(str);
    return -1;
  }
  FVar6 = (phVar2->private_data).out_headers;
  pFVar7 = &HTTP_HEADER_COOKIE;
LAB_00147073:
  set_header_add(FVar6,*pFVar7,str);
  return 0;
}

Assistant:

int http_set_cookie(http_s *h, http_cookie_args_s cookie) {
#if DEBUG
  FIO_ASSERT(h, "Can't set cookie for NULL HTTP handler!");
#endif
  if (HTTP_INVALID_HANDLE(h) || cookie.name_len >= 32768 ||
      cookie.value_len >= 131072) {
    return -1;
  }

  static int warn_illegal = 0;

  /* write name and value while auto-correcting encoding issues */
  size_t capa = cookie.name_len + cookie.value_len + 128;
  size_t len = 0;
  FIOBJ c = fiobj_str_buf(capa);
  fio_str_info_s t = fiobj_obj2cstr(c);

#define copy_cookie_ch(ch_var)                                                 \
  if (invalid_cookie_##ch_var##_char[(uint8_t)cookie.ch_var[tmp]]) {           \
    if (!warn_illegal) {                                                       \
      ++warn_illegal;                                                          \
      FIO_LOG_WARNING("illegal char 0x%.2x in cookie " #ch_var " (in %s)\n"    \
                      "         automatic %% encoding applied",                \
                      cookie.ch_var[tmp], cookie.ch_var);                      \
    }                                                                          \
    t.data[len++] = '%';                                                       \
    t.data[len++] = hex_chars[((uint8_t)cookie.ch_var[tmp] >> 4) & 0x0F];      \
    t.data[len++] = hex_chars[(uint8_t)cookie.ch_var[tmp] & 0x0F];             \
  } else {                                                                     \
    t.data[len++] = cookie.ch_var[tmp];                                        \
  }                                                                            \
  tmp += 1;                                                                    \
  if (capa <= len + 3) {                                                       \
    capa += 32;                                                                \
    fiobj_str_capa_assert(c, capa);                                            \
    t = fiobj_obj2cstr(c);                                                     \
  }

  if (cookie.name) {
    size_t tmp = 0;
    if (cookie.name_len) {
      while (tmp < cookie.name_len) {
        copy_cookie_ch(name);
      }
    } else {
      while (cookie.name[tmp]) {
        copy_cookie_ch(name);
      }
    }
  }
  t.data[len++] = '=';
  if (cookie.value) {
    size_t tmp = 0;
    if (cookie.value_len) {
      while (tmp < cookie.value_len) {
        copy_cookie_ch(value);
      }
    } else {
      while (cookie.value[tmp]) {
        copy_cookie_ch(value);
      }
    }
  } else
    cookie.max_age = -1;

  if (http_settings(h) && http_settings(h)->is_client) {
    if (!cookie.value) {
      fiobj_free(c);
      return -1;
    }
    set_header_add(h->private_data.out_headers, HTTP_HEADER_COOKIE, c);
    return 0;
  }

  t.data[len++] = ';';
  t.data[len++] = ' ';

  if (h->status_str || !h->status) { /* on first request status == 0 */
    static uint64_t cookie_hash;
    if (!cookie_hash)
      cookie_hash = fiobj_hash_string("cookie", 6);
    FIOBJ tmp = fiobj_hash_get2(h->private_data.out_headers, cookie_hash);
    if (!tmp) {
      set_header_add(h->private_data.out_headers, HTTP_HEADER_COOKIE, c);
    } else {
      fiobj_str_join(tmp, c);
      fiobj_free(c);
    }
    return 0;
  }

  if (capa <= len + 40) {
    capa = len + 40;
    fiobj_str_capa_assert(c, capa);
    t = fiobj_obj2cstr(c);
  }
  if (cookie.max_age) {
    memcpy(t.data + len, "Max-Age=", 8);
    len += 8;
    len += fio_ltoa(t.data + len, cookie.max_age, 10);
    t.data[len++] = ';';
    t.data[len++] = ' ';
  }
  fiobj_str_resize(c, len);

  if (cookie.domain && cookie.domain_len) {
    fiobj_str_write(c, "domain=", 7);
    fiobj_str_write(c, cookie.domain, cookie.domain_len);
    fiobj_str_write(c, ";", 1);
    t.data[len++] = ' ';
  }
  if (cookie.path && cookie.path_len) {
    fiobj_str_write(c, "path=", 5);
    fiobj_str_write(c, cookie.path, cookie.path_len);
    fiobj_str_write(c, ";", 1);
    t.data[len++] = ' ';
  }
  if (cookie.http_only) {
    fiobj_str_write(c, "HttpOnly;", 9);
  }
  if (cookie.secure) {
    fiobj_str_write(c, "secure;", 7);
  }
  set_header_add(h->private_data.out_headers, HTTP_HEADER_SET_COOKIE, c);
  return 0;
}